

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O0

int Pdr_ManCheckCubeCs(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  int iVar1;
  sat_solver *s;
  Vec_Int_t *p_00;
  abctime aVar2;
  int *begin;
  int *piVar3;
  int RetValue;
  abctime Limit;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  Pdr_Set_t *pCube_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  s = Pdr_ManFetchSolver(p,k);
  p_00 = Pdr_ManCubeToLits(p,k,pCube,0,0);
  aVar2 = Pdr_ManTimeLimit(p);
  aVar2 = sat_solver_set_runtime_limit(s,aVar2);
  begin = Vec_IntArray(p_00);
  piVar3 = Vec_IntArray(p_00);
  iVar1 = Vec_IntSize(p_00);
  iVar1 = sat_solver_solve(s,begin,piVar3 + iVar1,0,0,0,0);
  sat_solver_set_runtime_limit(s,aVar2);
  if (iVar1 == 0) {
    p_local._4_4_ = 0xffffffff;
  }
  else {
    p_local._4_4_ = (uint)(iVar1 == -1);
  }
  return p_local._4_4_;
}

Assistant:

int Pdr_ManCheckCubeCs( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{ 
    sat_solver * pSat;
    Vec_Int_t * vLits;
    abctime Limit;
    int RetValue;
    pSat = Pdr_ManFetchSolver( p, k );
    vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 0 );
    Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
    sat_solver_set_runtime_limit( pSat, Limit );
    if ( RetValue == l_Undef )
        return -1;
    return (RetValue == l_False);
}